

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_checkfinalizer(lua_State *L,GCObject *o,Table *mt)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  TValue *pTVar3;
  GCObject *pGVar4;
  
  if (((mt != (Table *)0x0) && ((o->marked & 8) == 0)) && ((mt->flags & 4) == 0)) {
    pgVar1 = L->l_G;
    pTVar3 = luaT_gettm(mt,TM_GC,pgVar1->tmname[2]);
    if (pTVar3 != (TValue *)0x0) {
      if ((byte)(pgVar1->gcstate - 2) < 4) {
        o->marked = pgVar1->currentwhite & 3 | o->marked & 0xf8;
        pGVar2 = (GCObject *)pgVar1->sweepgc;
        pGVar4 = pGVar2;
        if (pGVar2 == o) {
          do {
            pGVar4 = (GCObject *)sweeplist(L,&pGVar4->next,1);
          } while (pGVar4 == pGVar2);
          pgVar1->sweepgc = (GCObject **)pGVar4;
        }
      }
      pGVar2 = (GCObject *)&pgVar1->allgc;
      do {
        pGVar4 = pGVar2;
        pGVar2 = pGVar4->next;
      } while (pGVar2 != o);
      pGVar4->next = o->next;
      o->next = pgVar1->finobj;
      pgVar1->finobj = o;
      o->marked = o->marked | 8;
    }
  }
  return;
}

Assistant:

void luaC_checkfinalizer(lua_State *L, GCObject *o, Table *mt) {
    global_State *g = G(L);
    if (tofinalize(o) ||                 /* obj. is already marked... */
        gfasttm(g, mt, TM_GC) == NULL)   /* or has no finalizer? */
        return;  /* nothing to be done */
    else {  /* move 'o' to 'finobj' list */
        GCObject **p;
        if (issweepphase(g)) {
            makewhite(g, o);  /* "sweep" object 'o' */
            if (g->sweepgc == &o->next)  /* should not remove 'sweepgc' object */
                g->sweepgc = sweeptolive(L, g->sweepgc);  /* change 'sweepgc' */
        }
        /* search for pointer pointing to 'o' */
        for (p = &g->allgc; *p != o; p = &(*p)->next) { /* empty */ }
        *p = o->next;  /* remove 'o' from 'allgc' list */
        o->next = g->finobj;  /* link it in 'finobj' list */
        g->finobj = o;
        l_setbit(o->marked, FINALIZEDBIT);  /* mark it as such */
    }
}